

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68040_cinv(void)

{
  if ((g_cpu_type & 0x10) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    switch(g_cpu_ir >> 3 & 3) {
    case 0:
      sprintf(g_dasm_str,"cinv    (illegal scope); (4)");
      break;
    case 1:
      sprintf(g_dasm_str,"cinvl   %d, (A%d); (4)",(ulong)(g_cpu_ir >> 6 & 3),(ulong)(g_cpu_ir & 7));
      break;
    case 2:
      sprintf(g_dasm_str,"cinvp   %d, (A%d); (4)",(ulong)(g_cpu_ir >> 6 & 3),(ulong)(g_cpu_ir & 7));
      break;
    case 3:
      sprintf(g_dasm_str,"cinva   %d; (4)",(ulong)(g_cpu_ir >> 6 & 3));
    }
  }
  return;
}

Assistant:

static void d68040_cinv(void)
{
	LIMIT_CPU_TYPES(M68040_PLUS);
	switch((g_cpu_ir>>3)&3)
	{
		case 0:
			sprintf(g_dasm_str, "cinv    (illegal scope); (4)");
			break;
		case 1:
			sprintf(g_dasm_str, "cinvl   %d, (A%d); (4)", (g_cpu_ir>>6)&3, g_cpu_ir&7);
			break;
		case 2:
			sprintf(g_dasm_str, "cinvp   %d, (A%d); (4)", (g_cpu_ir>>6)&3, g_cpu_ir&7);
			break;
		case 3:
			sprintf(g_dasm_str, "cinva   %d; (4)", (g_cpu_ir>>6)&3);
			break;
	}
}